

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitRefEq(OptimizeInstructions *this,RefEq *curr)

{
  bool bVar1;
  Expression *pEVar2;
  Module *wasm;
  RefIsNull *rep;
  bool local_e9;
  Builder local_e8;
  Type local_e0;
  Literal local_d8;
  uintptr_t local_c0;
  uintptr_t local_b8;
  HeapType local_b0;
  Type local_a8;
  Type nullableEq;
  Type local_90;
  Literal local_88;
  uintptr_t local_70;
  uintptr_t local_68;
  undefined1 local_59;
  HeapType HStack_58;
  bool rightIsHeapSubtype;
  uintptr_t local_50;
  byte local_41;
  HeapType HStack_40;
  bool leftIsHeapSubtype;
  HeapType rightHeapType;
  HeapType leftHeapType;
  Type local_28;
  Type rightType;
  Type leftType;
  RefEq *curr_local;
  OptimizeInstructions *this_local;
  
  rightType.id = (curr->left->type).id;
  local_28.id = (curr->right->type).id;
  leftHeapType.id._4_4_ = 1;
  bVar1 = wasm::Type::operator==(&rightType,(BasicType *)((long)&leftHeapType.id + 4));
  local_e9 = true;
  if (!bVar1) {
    leftHeapType.id._0_4_ = 1;
    local_e9 = wasm::Type::operator==(&local_28,(BasicType *)&leftHeapType);
  }
  if (local_e9 == false) {
    rightHeapType = wasm::Type::getHeapType(&rightType);
    HStack_58 = wasm::Type::getHeapType(&local_28);
    local_50 = rightHeapType.id;
    HStack_40 = HStack_58;
    local_41 = HeapType::isSubType(rightHeapType,HStack_58);
    local_68 = HStack_40.id;
    local_70 = rightHeapType.id;
    local_59 = HeapType::isSubType(HStack_40,rightHeapType);
    if ((((local_41 & 1) != 0) || ((bool)local_59)) ||
       ((bVar1 = wasm::Type::isNonNullable(&rightType), !bVar1 &&
        (bVar1 = wasm::Type::isNonNullable(&local_28), !bVar1)))) {
      HeapType::HeapType(&local_b0,eq);
      wasm::Type::Type(&local_a8,local_b0,Nullable,Inexact);
      local_b8 = local_a8.id;
      skipCast(this,&curr->left,local_a8);
      local_c0 = local_a8.id;
      skipCast(this,&curr->right,local_a8);
      bVar1 = areConsecutiveInputsEqualAndFoldable(this,curr->left,curr->right);
      if (bVar1) {
        wasm::Type::Type(&local_e0,i32);
        wasm::Literal::makeOne(&local_d8,local_e0);
        pEVar2 = getDroppedChildrenAndAppend(this,(Expression *)curr,&local_d8);
        replaceCurrent(this,pEVar2);
        wasm::Literal::~Literal(&local_d8);
      }
      else {
        bVar1 = Expression::is<wasm::RefNull>(curr->left);
        if (bVar1) {
          std::swap<wasm::Expression*>(&curr->left,&curr->right);
        }
        bVar1 = Expression::is<wasm::RefNull>(curr->right);
        if (bVar1) {
          wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 ::getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).
                              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .
                              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            );
          Builder::Builder(&local_e8,wasm);
          rep = Builder::makeRefIsNull(&local_e8,curr->left);
          replaceCurrent(this,(Expression *)rep);
        }
      }
    }
    else {
      wasm::Type::Type(&local_90,i32);
      wasm::Literal::makeZero(&local_88,local_90);
      pEVar2 = getDroppedChildrenAndAppend(this,(Expression *)curr,&local_88);
      replaceCurrent(this,pEVar2);
      wasm::Literal::~Literal(&local_88);
    }
  }
  return;
}

Assistant:

void visitRefEq(RefEq* curr) {
    // The types may prove that the same reference cannot appear on both sides.
    auto leftType = curr->left->type;
    auto rightType = curr->right->type;
    if (leftType == Type::unreachable || rightType == Type::unreachable) {
      // Leave this for DCE.
      return;
    }
    auto leftHeapType = leftType.getHeapType();
    auto rightHeapType = rightType.getHeapType();
    auto leftIsHeapSubtype = HeapType::isSubType(leftHeapType, rightHeapType);
    auto rightIsHeapSubtype = HeapType::isSubType(rightHeapType, leftHeapType);
    if (!leftIsHeapSubtype && !rightIsHeapSubtype &&
        (leftType.isNonNullable() || rightType.isNonNullable())) {
      // The heap types have no intersection, so the only thing that can
      // possibly appear on both sides is null, but one of the two is non-
      // nullable, which rules that out. So there is no way that the same
      // reference can appear on both sides.
      replaceCurrent(
        getDroppedChildrenAndAppend(curr, Literal::makeZero(Type::i32)));
      return;
    }

    // Equality does not depend on the type, so casts may be removable.
    //
    // This is safe to do first because nothing farther down cares about the
    // type, and we consume the two input references, so removing a cast could
    // not help our parents (see "notes on removing casts").
    Type nullableEq = Type(HeapType::eq, Nullable);
    skipCast(curr->left, nullableEq);
    skipCast(curr->right, nullableEq);

    // Identical references compare equal.
    // (Technically we do not need to check if the inputs are also foldable into
    // a single one, but we do not have utility code to handle non-foldable
    // cases yet; the foldable case we do handle is the common one of the first
    // child being a tee and the second a get of that tee. TODO)
    if (areConsecutiveInputsEqualAndFoldable(curr->left, curr->right)) {
      replaceCurrent(
        getDroppedChildrenAndAppend(curr, Literal::makeOne(Type::i32)));
      return;
    }

    // Canonicalize to the pattern of a null on the right-hand side, if there is
    // one. This makes pattern matching simpler.
    if (curr->left->is<RefNull>()) {
      std::swap(curr->left, curr->right);
    }

    // RefEq of a value to Null can be replaced with RefIsNull.
    if (curr->right->is<RefNull>()) {
      replaceCurrent(Builder(*getModule()).makeRefIsNull(curr->left));
    }
  }